

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

Message * __thiscall
FIX::Session::newMessage(Message *__return_storage_ptr__,Session *this,MsgType *msgType)

{
  pointer pcVar1;
  DataDictionary *pDVar2;
  message_order *headerOrder;
  message_order *trailerOrder;
  void *pvVar3;
  message_order *pmVar4;
  Message *message;
  undefined1 local_88 [16];
  _Alloc_hider local_78;
  size_type local_70;
  char local_68 [16];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  field_metrics local_38;
  
  pDVar2 = DataDictionaryProvider::getSessionDataDictionary
                     (&this->m_dataDictionaryProvider,&(this->m_sessionID).m_beginString);
  if (pDVar2->m_storeMsgFieldsOrder == false) {
    Message::Message(__return_storage_ptr__);
    FieldMap::setField(&(__return_storage_ptr__->m_header).super_FieldMap,(FieldBase *)msgType,true)
    ;
    return __return_storage_ptr__;
  }
  headerOrder = DataDictionary::getHeaderOrderedFields(pDVar2);
  trailerOrder = DataDictionary::getTrailerOrderedFields(pDVar2);
  if ((this->m_sessionID).m_isFIXT == true) {
    local_88._0_8_ = &PTR__FieldBase_001f55c8;
    local_88._8_4_ = 0x23;
    local_78._M_p = local_68;
    pcVar1 = (msgType->super_StringField).super_FieldBase.m_string._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar1,
               pcVar1 + (msgType->super_StringField).super_FieldBase.m_string._M_string_length);
    local_58._M_p = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_38.m_length = 0;
    local_38.m_checksum = 0;
    local_88._0_8_ = &PTR__FieldBase_001f6658;
    if (local_70 == 1) {
      pvVar3 = memchr("0A12345",(int)*local_78._M_p,8);
      FieldBase::~FieldBase((FieldBase *)local_88);
      if (pvVar3 != (void *)0x0) goto LAB_001a90ac;
    }
    else {
      FieldBase::~FieldBase((FieldBase *)local_88);
    }
    local_88._0_8_ = &PTR__FieldBase_001f55c8;
    local_88._8_4_ = 0x468;
    local_78._M_p = local_68;
    pcVar1 = (this->m_senderDefaultApplVerID)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar1,pcVar1 + (this->m_senderDefaultApplVerID)._M_string_length
              );
    local_58._M_p = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_38.m_length = 0;
    local_38.m_checksum = 0;
    local_88._0_8_ = &PTR__FieldBase_001f7058;
    pDVar2 = DataDictionaryProvider::getApplicationDataDictionary
                       (&this->m_dataDictionaryProvider,(ApplVerID *)local_88);
    FieldBase::~FieldBase((FieldBase *)local_88);
    pmVar4 = DataDictionary::getMessageOrderedFields
                       (pDVar2,&(msgType->super_StringField).super_FieldBase.m_string);
    Message::Message(__return_storage_ptr__,headerOrder,trailerOrder,pmVar4);
    FieldMap::setField(&(__return_storage_ptr__->m_header).super_FieldMap,(FieldBase *)msgType,true)
    ;
  }
  else {
LAB_001a90ac:
    pmVar4 = DataDictionary::getMessageOrderedFields
                       (pDVar2,&(msgType->super_StringField).super_FieldBase.m_string);
    Message::Message(__return_storage_ptr__,headerOrder,trailerOrder,pmVar4);
    FieldMap::setField(&(__return_storage_ptr__->m_header).super_FieldMap,(FieldBase *)msgType,true)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

Message Session::newMessage(const MsgType &msgType) const {
  const DataDictionary &sessionDD = m_dataDictionaryProvider.getSessionDataDictionary(m_sessionID.getBeginString());

  if (!sessionDD.isMessageFieldsOrderPreserved()) {
    Message message = Message();
    message.getHeader().setField(msgType);
    return message;
  } else {
    const message_order &headerOrder = sessionDD.getHeaderOrderedFields();
    const message_order &trailerOrder = sessionDD.getTrailerOrderedFields();
    if (!m_sessionID.isFIXT() || Message::isAdminMsgType(msgType.getValue())) {
      const message_order &messageOrder = sessionDD.getMessageOrderedFields(msgType.getValue());
      Message message = Message(headerOrder, trailerOrder, messageOrder);
      message.getHeader().setField(msgType);
      return message;
    } else {
      const DataDictionary &applicationDD
          = m_dataDictionaryProvider.getApplicationDataDictionary(m_senderDefaultApplVerID);
      const message_order &messageOrder = applicationDD.getMessageOrderedFields(msgType.getValue());
      Message message = Message(headerOrder, trailerOrder, messageOrder);
      message.getHeader().setField(msgType);
      return message;
    }
  }
}